

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O1

uint32_t skynet_handle_register(skynet_context *ctx)

{
  bool bVar1;
  handle_storage *phVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  skynet_context **__s;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint unaff_EBP;
  size_t __size;
  long lVar9;
  
  phVar2 = H;
  do {
    LOCK();
    iVar4 = (phVar2->lock).write;
    (phVar2->lock).write = 1;
    UNLOCK();
  } while (iVar4 != 0);
  do {
  } while ((phVar2->lock).read != 0);
  do {
    iVar4 = phVar2->slot_size;
    bVar1 = 0 < iVar4;
    if (0 < iVar4) {
      iVar7 = 0;
      do {
        uVar8 = phVar2->handle_index + iVar7 & 0xffffff;
        uVar3 = iVar4 - 1U & uVar8;
        if (phVar2->slot[uVar3] == (skynet_context *)0x0) {
          phVar2->slot[uVar3] = ctx;
          phVar2->handle_index = uVar8 + 1;
          (phVar2->lock).write = 0;
          unaff_EBP = uVar8 | phVar2->harbor;
          goto LAB_00113484;
        }
        iVar7 = iVar7 + 1;
        iVar4 = phVar2->slot_size;
        bVar1 = iVar7 < iVar4;
      } while (iVar7 < iVar4);
    }
    if (0x800000 < iVar4) {
      __assert_fail("(s->slot_size*2 - 1) <= HANDLE_MASK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                    ,0x37,"uint32_t skynet_handle_register(struct skynet_context *)");
    }
    __size = (long)(iVar4 * 2) << 3;
    __s = (skynet_context **)malloc(__size);
    memset(__s,0,__size);
    if (0 < phVar2->slot_size) {
      lVar9 = 0;
      do {
        uVar5 = skynet_context_handle(phVar2->slot[lVar9]);
        uVar6 = (long)(int)uVar5 & (long)phVar2->slot_size * 2 - 1U;
        if (__s[uVar6] != (skynet_context *)0x0) {
          __assert_fail("new_slot[hash] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                        ,0x3c,"uint32_t skynet_handle_register(struct skynet_context *)");
        }
        __s[uVar6] = phVar2->slot[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < phVar2->slot_size);
    }
    free(phVar2->slot);
    phVar2->slot = __s;
    phVar2->slot_size = phVar2->slot_size << 1;
LAB_00113484:
    if (bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

uint32_t
skynet_handle_register(struct skynet_context *ctx) {
	struct handle_storage *s = H;

	rwlock_wlock(&s->lock);
	
	for (;;) {
		int i;
		for (i=0;i<s->slot_size;i++) {
			uint32_t handle = (i+s->handle_index) & HANDLE_MASK;
			int hash = handle & (s->slot_size-1);
			if (s->slot[hash] == NULL) {
				s->slot[hash] = ctx;
				s->handle_index = handle + 1;

				rwlock_wunlock(&s->lock);

				handle |= s->harbor;
				return handle;
			}
		}
		assert((s->slot_size*2 - 1) <= HANDLE_MASK);
		struct skynet_context ** new_slot = skynet_malloc(s->slot_size * 2 * sizeof(struct skynet_context *));
		memset(new_slot, 0, s->slot_size * 2 * sizeof(struct skynet_context *));
		for (i=0;i<s->slot_size;i++) {
			int hash = skynet_context_handle(s->slot[i]) & (s->slot_size * 2 - 1);
			assert(new_slot[hash] == NULL);
			new_slot[hash] = s->slot[i];
		}
		skynet_free(s->slot);
		s->slot = new_slot;
		s->slot_size *= 2;
	}
}